

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_ssnode_dfs.c
# Opt level: O3

int ilu_ssnode_dfs(int jcol,int kcol,int_t *asub,int_t *xa_begin,int_t *xa_end,int *marker,
                  GlobalLU_t *Glu)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int_t iVar4;
  int_t *piVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int next;
  long lVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  int_t local_70;
  int local_6c;
  int *local_68;
  long local_60;
  long local_58;
  int_t *local_50;
  int *local_48;
  int_t *local_40;
  long local_38;
  
  local_48 = Glu->xsup;
  local_68 = Glu->supno;
  piVar5 = Glu->lsub;
  local_50 = Glu->xlsub;
  local_70 = Glu->nzlmax;
  lVar10 = (long)jcol;
  local_58 = (long)local_68[lVar10];
  iVar6 = local_68[lVar10] + 1;
  local_68[lVar10] = iVar6;
  next = local_50[lVar10];
  local_60 = lVar10;
  if (jcol <= kcol) {
    local_6c = kcol + 1;
    local_40 = xa_begin;
    do {
      lVar7 = (long)local_40[lVar10];
      local_38 = lVar10;
      if (local_40[lVar10] < xa_end[lVar10]) {
        do {
          iVar12 = asub[lVar7];
          if (marker[iVar12] != kcol) {
            marker[iVar12] = kcol;
            lVar8 = (long)next;
            next = next + 1;
            piVar5[lVar8] = iVar12;
            if (local_70 <= next) {
              iVar4 = sLUMemXpand(jcol,next,LSUB,&local_70,Glu);
              if (iVar4 != 0) {
                return iVar4;
              }
              piVar5 = Glu->lsub;
              lVar10 = local_38;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < xa_end[lVar10]);
      }
      local_68[lVar10] = iVar6;
      lVar10 = lVar10 + 1;
    } while (local_6c != (int)lVar10);
  }
  auVar3 = _DAT_0011a510;
  auVar2 = _DAT_0011a500;
  auVar1 = _DAT_0011a4a0;
  lVar10 = (long)kcol;
  if (jcol < kcol) {
    lVar7 = (lVar10 - local_60) + -1;
    auVar11._8_4_ = (int)lVar7;
    auVar11._0_8_ = lVar7;
    auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar9 = 0;
    auVar11 = auVar11 ^ _DAT_0011a4a0;
    do {
      auVar13._8_4_ = (int)uVar9;
      auVar13._0_8_ = uVar9;
      auVar13._12_4_ = (int)(uVar9 >> 0x20);
      auVar14 = (auVar13 | auVar3) ^ auVar1;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_ ||
                  iVar12 < auVar14._4_4_) & 1)) {
        local_50[local_60 + uVar9 + 1] = next;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        local_50[local_60 + uVar9 + 2] = next;
      }
      auVar13 = (auVar13 | auVar2) ^ auVar1;
      iVar15 = auVar13._4_4_;
      if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar13._0_4_ <= auVar11._0_4_)) {
        local_50[local_60 + uVar9 + 3] = next;
        local_50[local_60 + uVar9 + 4] = next;
      }
      uVar9 = uVar9 + 4;
    } while (((lVar10 - local_60) + 3U & 0xfffffffffffffffc) != uVar9);
  }
  local_48[local_58 + 2] = kcol + 1;
  local_68[lVar10 + 1] = iVar6;
  local_50[lVar10 + 1] = next;
  return 0;
}

Assistant:

int
ilu_ssnode_dfs(
	   const int  jcol,	    /* in - start of the supernode */
	   const int  kcol,	    /* in - end of the supernode */
	   const int_t  *asub,	    /* in */
	   const int_t  *xa_begin,    /* in */
	   const int_t  *xa_end,	    /* in */
	   int	      *marker,	    /* modified */
	   GlobalLU_t *Glu	    /* modified */
	   )
{
    int_t i, k, nextl, mem_error;
    int   nsuper, krow, kmark;
    int   *xsup, *supno;
    int_t *lsub, *xlsub;
    int_t nzlmax;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    nzlmax  = Glu->nzlmax;

    nsuper = ++supno[jcol];	/* Next available supernode number */
    nextl = xlsub[jcol];

    for (i = jcol; i <= kcol; i++)
    {
	/* For each nonzero in A[*,i] */
	for (k = xa_begin[i]; k < xa_end[i]; k++)
	{
	    krow = asub[k];
	    kmark = marker[krow];
	    if ( kmark != kcol )
	    { /* First time visit krow */
		marker[krow] = kcol;
		lsub[nextl++] = krow;
		if ( nextl >= nzlmax )
		{
		    if ( (mem_error = sLUMemXpand(jcol, nextl, LSUB, &nzlmax,
			    Glu)) != 0)
			return (mem_error);
		    lsub = Glu->lsub;
		}
	    }
	}
	supno[i] = nsuper;
    }

    /* Supernode > 1 */
    if ( jcol < kcol )
	for (i = jcol+1; i <= kcol; i++) xlsub[i] = nextl;

    xsup[nsuper+1] = kcol + 1;
    supno[kcol+1]  = nsuper;
    xlsub[kcol+1]  = nextl;

    return 0;
}